

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall
helics::CommsInterface::loadTargetInfo
          (CommsInterface *this,string_view localTarget,string_view brokerTarget,
          InterfaceNetworks targetNetwork)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_30._M_str = brokerTarget._M_str;
  local_30._M_len = brokerTarget._M_len;
  local_20._M_str = localTarget._M_str;
  local_20._M_len = localTarget._M_len;
  bVar1 = propertyLock(this);
  if (bVar1) {
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&this->localTargetAddress,&local_20);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&this->brokerTargetAddress,&local_30);
    this->interfaceNetwork = targetNetwork;
    propertyUnLock(this);
  }
  return;
}

Assistant:

void CommsInterface::loadTargetInfo(std::string_view localTarget,
                                    std::string_view brokerTarget,
                                    gmlc::networking::InterfaceNetworks targetNetwork)
{
    if (propertyLock()) {
        localTargetAddress = localTarget;
        brokerTargetAddress = brokerTarget;
        interfaceNetwork = targetNetwork;
        propertyUnLock();
    }
}